

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::ReorganizeDataLayerParams::ByteSizeLong(ReorganizeDataLayerParams *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (this->blocksize_ == 0) {
    sVar5 = 0;
  }
  else {
    uVar4 = this->blocksize_ | 1;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar5 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  uVar1 = this->mode_;
  if (uVar1 != 0) {
    if ((int)uVar1 < 0) {
      uVar4 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar5 = sVar5 + uVar4;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

inline ::google::protobuf::uint64 ReorganizeDataLayerParams::blocksize() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.ReorganizeDataLayerParams.blockSize)
  return blocksize_;
}